

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_codes_writer.c
# Opt level: O0

void write_primitive_subexpfin(aom_writer *w,uint16_t n,uint16_t k,uint16_t v)

{
  uint bits;
  int iVar1;
  ushort in_CX;
  ushort in_DX;
  ushort in_SI;
  int t;
  int a;
  int b;
  int mk;
  int i;
  uint in_stack_ffffffffffffffdc;
  uint uVar2;
  int local_18;
  int local_14;
  
  local_14 = 0;
  local_18 = 0;
  while( true ) {
    if (local_14 == 0) {
      bits = (uint)in_DX;
    }
    else {
      bits = ((uint)in_DX + local_14) - 1;
    }
    iVar1 = 1 << ((byte)bits & 0x1f);
    if ((int)(uint)in_SI <= local_18 + iVar1 * 3) break;
    in_stack_ffffffffffffffdc = (uint)(local_18 + iVar1 <= (int)(uint)in_CX);
    uVar2 = bits;
    aom_write_bit((aom_writer *)CONCAT44(bits,iVar1),in_stack_ffffffffffffffdc);
    if (in_stack_ffffffffffffffdc == 0) {
      aom_write_literal((aom_writer *)CONCAT44(uVar2,iVar1),0,bits);
      return;
    }
    local_14 = local_14 + 1;
    local_18 = iVar1 + local_18;
  }
  write_primitive_quniform
            ((aom_writer *)CONCAT44(bits,iVar1),(uint16_t)(in_stack_ffffffffffffffdc >> 0x10),
             (uint16_t)in_stack_ffffffffffffffdc);
  return;
}

Assistant:

static void write_primitive_subexpfin(aom_writer *w, uint16_t n, uint16_t k,
                                      uint16_t v) {
  int i = 0;
  int mk = 0;
  while (1) {
    int b = (i ? k + i - 1 : k);
    int a = (1 << b);
    if (n <= mk + 3 * a) {
      write_primitive_quniform(w, n - mk, v - mk);
      break;
    } else {
      int t = (v >= mk + a);
      aom_write_bit(w, t);
      if (t) {
        i = i + 1;
        mk += a;
      } else {
        aom_write_literal(w, v - mk, b);
        break;
      }
    }
  }
}